

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall
Inline::InlineApplyWithoutArrayArgument
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *applyInfo,
          FunctionJITTimeInfo *applyTargetInfo)

{
  code *pcVar1;
  Instr *pIVar2;
  Instr *pIVar3;
  bool bVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  StackSym *pSVar7;
  SymOpnd *dstOpnd_00;
  ByteCodeUsesInstr *this_00;
  Inline *this_01;
  byte bVar8;
  Instr *local_70;
  Instr *implicitThisArgOut;
  uint local_5c;
  Instr *pIStack_58;
  uint argOutCount;
  Instr *explicitThisArgOut;
  Inline *local_48;
  FunctionJITTimeInfo *local_40;
  bool local_31;
  
  pIVar6 = callInstr->m_next;
  local_70 = (Instr *)0x0;
  pIStack_58 = (Instr *)0x0;
  local_5c = 0;
  local_48 = this;
  local_40 = applyTargetInfo;
  GetArgInstrsForCallAndApply
            (this,callInstr,&local_70,&stack0xffffffffffffffa8,&implicitThisArgOut,&local_5c);
  pIVar2 = local_70;
  if (local_70 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xacd,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar4) goto LAB_00550615;
    *puVar5 = 0;
  }
  pIVar3 = pIStack_58;
  explicitThisArgOut = pIVar6;
  if (pIStack_58 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xace,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar4) goto LAB_00550615;
    *puVar5 = 0;
  }
  this_01 = local_48;
  EmitFixedMethodOrFunctionObjectChecksForBuiltIns
            (local_48,callInstr,callInstr,applyInfo,false,true,false,true);
  pIVar6 = InsertInlineeBuiltInStartEndTags(this_01,callInstr,2,(Instr **)0x0);
  pIVar6->m_opcode = InlineNonTrackingBuiltInEnd;
  dstOpnd = IR::RegOpnd::New(TyVar,callInstr->m_func);
  src1Opnd = IR::IntConstOpnd::New(1,TyInt32,callInstr->m_func,false);
  pIVar6 = IR::Instr::New(StartCall,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar6);
  pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
  dstOpnd_00 = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyVar,callInstr->m_func);
  pIVar6 = IR::Instr::New(ArgOut_A,&dstOpnd_00->super_Opnd,pIVar3->m_src1,pIVar6->m_dst,
                          callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar6);
  IR::Instr::ReplaceSrc1(callInstr,pIVar2->m_src1);
  IR::Instr::ReplaceSrc2(callInstr,&dstOpnd_00->super_Opnd);
  callInstr->m_opcode = CallI;
  pSVar7 = IR::Opnd::GetStackSym(callInstr->m_src1);
  pIVar2 = explicitThisArgOut;
  pIVar6 = (pSVar7->field_5).m_instrDef;
  if ((pIVar6 != (Instr *)0x0 & pSVar7->field_0x18) == 1) {
    if (pIVar6->m_opcode == BytecodeArgOutCapture) {
      do {
        bVar8 = pIVar6->m_src1->field_0xb;
        pSVar7 = IR::Opnd::GetStackSym(pIVar6->m_src1);
        if ((pSVar7->field_0x18 & 1) == 0) {
          return pIVar2;
        }
        pIVar6 = (pSVar7->field_5).m_instrDef;
        if (pIVar6 == (Instr *)0x0) {
          return pIVar2;
        }
      } while (pIVar6->m_opcode == BytecodeArgOutCapture);
    }
    else {
      bVar8 = callInstr->m_src1->field_0xb;
    }
    if ((local_40 != (FunctionJITTimeInfo *)0x0) &&
       (bVar4 = TryOptimizeCallInstrWithFixedMethod
                          (local_48,callInstr,local_40,false,false,false,true,&local_31,false,0),
       bVar4)) {
      if (callInstr->m_opcode != CallIFixed) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0xaf9,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                           "callInstr->m_opcode == Js::OpCode::CallIFixed");
        if (!bVar4) {
LAB_00550615:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      this_00 = IR::ByteCodeUsesInstr::New(callInstr);
      IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                (this_00,(bool)((bVar8 & 8) >> 3),(pSVar7->super_Sym).m_id);
      IR::Instr::InsertBefore(callInstr,&this_00->super_Instr);
    }
  }
  return pIVar2;
}

Assistant:

IR::Instr * Inline::InlineApplyWithoutArrayArgument(IR::Instr *callInstr, const FunctionJITTimeInfo * applyInfo, const FunctionJITTimeInfo * applyTargetInfo)
{
    IR::Instr * instrNext = callInstr->m_next;
    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * dummyInstr = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &dummyInstr, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);

    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, applyInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, 2); // 2 args (implicit this + explicit this)
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    IR::Instr * startCall = IR::Instr::New(Js::OpCode::StartCall,
        IR::RegOpnd::New(TyVar, callInstr->m_func),
        IR::IntConstOpnd::New(1, TyInt32, callInstr->m_func),
        callInstr->m_func);
    callInstr->InsertBefore(startCall);

    StackSym* symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    IR::SymOpnd* linkOpnd = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);
    IR::Instr* thisArgOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, explicitThisArgOut->GetSrc1(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(thisArgOut);

    callInstr->ReplaceSrc1(implicitThisArgOut->GetSrc1());
    callInstr->ReplaceSrc2(linkOpnd);
    callInstr->m_opcode = Js::OpCode::CallI;

    StackSym* callTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool callTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    while (callTargetStackSym->IsSingleDef() && callTargetStackSym->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)
    {
        callTargetOpndIsJITOpt = callTargetStackSym->GetInstrDef()->GetSrc1()->GetIsJITOptimizedReg();
        callTargetStackSym = callTargetStackSym->GetInstrDef()->GetSrc1()->GetStackSym();
    }

    if (!callTargetStackSym->IsSingleDef())
    {
        return instrNext;
    }

    if (!applyTargetInfo)
    {
        return instrNext;
    }

    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, applyTargetInfo, false /*isPolymorphic*/, false /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis /*unused here*/))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
        bytecodeUses->SetRemovedOpndSymbol(callTargetOpndIsJITOpt, callTargetStackSym->m_id);
        callInstr->InsertBefore(bytecodeUses);
    }

    return instrNext;
}